

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O3

uint __thiscall
pktalloc::CustomBitSet<64U>::RangePopcount(CustomBitSet<64U> *this,uint bitStart,uint bitEnd)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  uint uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar9 [32];
  
  uVar14 = 0;
  if (bitStart < bitEnd) {
    uVar4 = bitStart >> 6;
    uVar6 = bitEnd >> 6;
    uVar3 = this[uVar4].Words[0] >> ((ulong)bitStart & 0x3f);
    if (uVar6 == uVar4) {
      uVar14 = (uint)POPCOUNT(uVar3 << ((ulong)(bitStart - bitEnd) & 0x3f));
    }
    else {
      uVar14 = (uint)POPCOUNT(uVar3);
      uVar3 = (ulong)(uVar4 + 1);
      if (uVar4 + 1 < uVar6) {
        auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar3 = (ulong)uVar6;
        uVar5 = 0;
        auVar11 = vpbroadcastq_avx512f();
        auVar12 = ZEXT464(uVar14);
        do {
          auVar15 = auVar12;
          auVar12 = vpbroadcastq_avx512f();
          auVar12 = vporq_avx512f(auVar12,auVar10);
          uVar2 = vpcmpuq_avx512f(auVar12,auVar11,2);
          auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])(this + (ulong)uVar4 + uVar5 + 1));
          auVar13._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar12._8_8_;
          auVar13._0_8_ = (ulong)((byte)uVar2 & 1) * auVar12._0_8_;
          auVar13._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar12._16_8_;
          auVar13._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar12._24_8_;
          auVar13._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar12._32_8_;
          auVar13._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar12._40_8_;
          auVar13._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar12._48_8_;
          auVar13._56_8_ = (uVar2 >> 7) * auVar12._56_8_;
          uVar5 = uVar5 + 8;
          auVar12 = vpopcntq_avx512_vpopcntdq(auVar13);
          auVar8 = vpmovqd_avx512f(auVar12);
          auVar8 = vpaddd_avx2(auVar15._0_32_,auVar8);
          auVar12 = ZEXT3264(auVar8);
        } while (((long)(int)~uVar4 + 7 + uVar3 & 0xfffffffffffffff8) != uVar5);
        auVar8 = vmovdqa32_avx512vl(auVar8);
        bVar1 = (bool)((byte)uVar2 & 1);
        auVar7._0_4_ = (uint)bVar1 * auVar8._0_4_ | (uint)!bVar1 * auVar15._0_4_;
        bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
        auVar7._4_4_ = (uint)bVar1 * auVar8._4_4_ | (uint)!bVar1 * auVar15._4_4_;
        bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
        auVar7._8_4_ = (uint)bVar1 * auVar8._8_4_ | (uint)!bVar1 * auVar15._8_4_;
        bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
        auVar7._12_4_ = (uint)bVar1 * auVar8._12_4_ | (uint)!bVar1 * auVar15._12_4_;
        bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
        auVar9._16_4_ = (uint)bVar1 * auVar8._16_4_ | (uint)!bVar1 * auVar15._16_4_;
        auVar9._0_16_ = auVar7;
        bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
        auVar9._20_4_ = (uint)bVar1 * auVar8._20_4_ | (uint)!bVar1 * auVar15._20_4_;
        bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
        auVar9._24_4_ = (uint)bVar1 * auVar8._24_4_ | (uint)!bVar1 * auVar15._24_4_;
        bVar1 = SUB81(uVar2 >> 7,0);
        auVar9._28_4_ = (uint)bVar1 * auVar8._28_4_ | (uint)!bVar1 * auVar15._28_4_;
        auVar7 = vphaddd_avx(auVar9._16_16_,auVar7);
        auVar7 = vphaddd_avx(auVar7,auVar7);
        auVar7 = vphaddd_avx(auVar7,auVar7);
        uVar14 = auVar7._0_4_;
      }
      uVar4 = (int)uVar3 * 0x40 - bitEnd;
      if (uVar4 != 0) {
        return uVar14 + (int)POPCOUNT(this[uVar3].Words[0] << ((ulong)uVar4 & 0x3f));
      }
    }
  }
  return uVar14;
}

Assistant:

unsigned RangePopcount(unsigned bitStart, unsigned bitEnd)
    {
        static_assert(kWordBits == 64, "Update this");

        if (bitStart >= bitEnd) {
            return 0;
        }

        unsigned wordIndex = bitStart / kWordBits;
        const unsigned wordEnd = bitEnd / kWordBits;

        // Eliminate low bits of first word
        WordT word = Words[wordIndex] >> (bitStart % kWordBits);

        // Eliminate high bits of last word if there is just one word
        if (wordEnd == wordIndex) {
            return PopCount64(word << (kWordBits - (bitEnd - bitStart)));
        }

        // Count remainder of first word
        unsigned count = PopCount64(word);

        // Accumulate popcount of full words
        while (++wordIndex < wordEnd) {
            count += PopCount64(Words[wordIndex]);
        }

        // Eliminate high bits of last word if there is one
        const unsigned lastWordBits = bitEnd - wordIndex * kWordBits;
        if (lastWordBits > 0) {
            count += PopCount64(Words[wordIndex] << (kWordBits - lastWordBits));
        }

        return count;
    }